

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

Breakdown * absl::anon_unknown_8::InfinitePastBreakdown(void)

{
  long lVar1;
  Breakdown *in_RDI;
  Duration DVar2;
  Duration d;
  Breakdown *bd;
  
  Time::Breakdown::Breakdown(in_RDI);
  lVar1 = std::numeric_limits<long>::min();
  in_RDI->year = lVar1;
  in_RDI->month = 1;
  in_RDI->day = 1;
  in_RDI->hour = 0;
  in_RDI->minute = 0;
  in_RDI->second = 0;
  DVar2 = InfiniteDuration();
  d._12_4_ = 0;
  d.rep_hi_ = SUB128(DVar2._0_12_,0);
  d.rep_lo_ = SUB124(DVar2._0_12_,8);
  DVar2 = absl::operator-(d);
  (in_RDI->subsecond).rep_hi_ = DVar2.rep_hi_;
  (in_RDI->subsecond).rep_lo_ = DVar2.rep_lo_;
  in_RDI->weekday = 7;
  in_RDI->yearday = 1;
  in_RDI->offset = 0;
  in_RDI->is_dst = false;
  in_RDI->zone_abbr = "-00";
  return in_RDI;
}

Assistant:

inline absl::Time::Breakdown InfinitePastBreakdown() {
  Time::Breakdown bd;
  bd.year = std::numeric_limits<int64_t>::min();
  bd.month = 1;
  bd.day = 1;
  bd.hour = 0;
  bd.minute = 0;
  bd.second = 0;
  bd.subsecond = -absl::InfiniteDuration();
  bd.weekday = 7;
  bd.yearday = 1;
  bd.offset = 0;
  bd.is_dst = false;
  bd.zone_abbr = "-00";
  return bd;
}